

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::EmitClosureRangeChecks(IRBuilder *this)

{
  Instr **ppIVar1;
  SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Type pJVar3;
  JitArenaAllocator *pJVar4;
  code *pcVar5;
  IRBuilder *pIVar6;
  bool bVar7;
  OpndKind OVar8;
  byte bVar9;
  BOOL BVar10;
  uint uVar11;
  undefined4 *puVar12;
  Type *pTVar13;
  StackSym *pSVar14;
  Opnd *this_00;
  Instr *instr;
  RegOpnd *newDst;
  AddrOpnd *this_01;
  JITTimeFunctionBody *this_02;
  BVSparse<Memory::JitArenaAllocator> *this_03;
  Func *pFVar15;
  Instr *pIVar16;
  ByteCodeUsesInstr *this_04;
  FrameDisplayCheckTable *pFVar17;
  Instr *pIVar18;
  ulong uVar19;
  Iterator local_48;
  IRBuilder *local_38;
  
  pFVar15 = this->m_func;
  pFVar17 = pFVar15->frameDisplayCheckTable;
  local_38 = this;
  if ((pFVar17 != (FrameDisplayCheckTable *)0x0) && (pFVar17->tableSize != 0)) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar19 = 0;
    do {
      local_48.list = pFVar17->table + uVar19;
      local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      while( true ) {
        if ((SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)
            local_48.current ==
            (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        pSVar2 = (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((SListNodeBase<Memory::ArenaAllocator> *)&(local_48.current)->next)->next;
        if (pSVar2 == local_48.list) break;
        local_48.current = (NodeBase *)pSVar2;
        pTVar13 = SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data(&local_48);
        pSVar14 = SymTable::FindStackSym(local_38->m_func->m_symTable,pTVar13->value);
        if ((pSVar14 == (StackSym *)0x0) ||
           (pIVar18 = (pSVar14->field_5).m_instrDef, pIVar18 == (Instr *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,899,"(stackSym && stackSym->m_instrDef)",
                             "stackSym && stackSym->m_instrDef");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
          pIVar18 = (pSVar14->field_5).m_instrDef;
        }
        pIVar16 = pIVar18->m_next;
        this_00 = IR::Instr::UnlinkDst(pIVar18);
        OVar8 = IR::Opnd::GetKind(this_00);
        if (OVar8 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        pIVar6 = local_38;
        instr = IR::Instr::New(FrameDisplayCheck,this_00,local_38->m_func);
        newDst = IR::RegOpnd::New(TyVar,pIVar6->m_func);
        IR::Instr::SetDst(pIVar18,&newDst->super_Opnd);
        if (instr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        pFVar15 = instr->m_func;
        if ((newDst->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        bVar9 = (newDst->super_Opnd).field_0xb;
        if ((bVar9 & 2) != 0) {
          newDst = (RegOpnd *)IR::Opnd::Copy(&newDst->super_Opnd,pFVar15);
          bVar9 = (newDst->super_Opnd).field_0xb;
        }
        (newDst->super_Opnd).field_0xb = bVar9 | 2;
        instr->m_src1 = &newDst->super_Opnd;
        this_01 = IR::AddrOpnd::New(pTVar13->element,AddrOpndKindDynamicMisc,local_38->m_func,true,
                                    (Var)0x0);
        if (instr->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        pFVar15 = instr->m_func;
        if ((this_01->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar7) goto LAB_004c868a;
          *puVar12 = 0;
        }
        bVar9 = (this_01->super_Opnd).field_0xb;
        if ((bVar9 & 2) != 0) {
          this_01 = (AddrOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar15);
          bVar9 = (this_01->super_Opnd).field_0xb;
        }
        (this_01->super_Opnd).field_0xb = bVar9 | 2;
        instr->m_src2 = &this_01->super_Opnd;
        IR::Instr::InsertBefore(pIVar16,instr);
      }
      uVar19 = uVar19 + 1;
      pFVar15 = local_38->m_func;
      pFVar17 = pFVar15->frameDisplayCheckTable;
    } while (uVar19 < pFVar17->tableSize);
  }
  bVar7 = JITTimeWorkItem::IsLoopBody(pFVar15->m_workItem);
  if ((!bVar7) && (BVar10 = Func::HasTry(local_38->m_func), BVar10 != 0)) {
    this_02 = JITTimeWorkItem::GetJITFunctionBody(local_38->m_func->m_workItem);
    uVar11 = JITTimeFunctionBody::GetByteCodeInLoopCount(this_02);
    if (uVar11 != 0) {
      pFVar15 = local_38->m_func;
      if ((pFVar15->m_localClosureSym == (StackSym *)0x0) ||
         ((pFVar15->m_localClosureSym->field_0x19 & 0x20) == 0)) {
        this_03 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      else {
        this_03 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pFVar15->m_alloc,0x3eba5c);
        pIVar6 = local_38;
        pJVar3 = local_38->m_func->m_alloc;
        this_03->head = (Type_conflict)0x0;
        this_03->lastFoundIndex = (Type_conflict)0x0;
        this_03->alloc = pJVar3;
        this_03->lastUsedNodePrevNextField = (Type)this_03;
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this_03,(local_38->m_func->m_localClosureSym->super_Sym).m_id);
        pFVar15 = pIVar6->m_func;
      }
      pSVar14 = pFVar15->m_localFrameDisplaySym;
      if ((pSVar14 == (StackSym *)0x0) || ((pSVar14->field_0x19 & 0x20) == 0)) {
        if (this_03 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          return;
        }
      }
      else {
        if (this_03 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          this_03 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,pFVar15->m_alloc,0x3eba5c);
          pJVar4 = local_38->m_func->m_alloc;
          this_03->head = (Type_conflict)0x0;
          this_03->lastFoundIndex = (Type_conflict)0x0;
          this_03->alloc = pJVar4;
          this_03->lastUsedNodePrevNextField = (Type)this_03;
          pSVar14 = local_38->m_func->m_localFrameDisplaySym;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(this_03,(pSVar14->super_Sym).m_id);
        pFVar15 = local_38->m_func;
      }
      pIVar18 = pFVar15->m_tailInstr;
      if (pIVar18 != (Instr *)0x0) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        pIVar16 = (Instr *)0x0;
        do {
          if ((pIVar16 != (Instr *)0x0) && (pIVar16->m_prev != pIVar18)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x3ab,
                               "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                               "Modifying instr list but not using EDITING iterator!");
            if (!bVar7) {
LAB_004c868a:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar12 = 0;
          }
          if (pIVar18->m_opcode == Ret) {
            this_04 = IR::ByteCodeUsesInstr::New(pIVar18);
            IR::ByteCodeUsesInstr::SetBV(this_04,this_03);
            IR::Instr::InsertBefore(pIVar18,&this_04->super_Instr);
            return;
          }
          ppIVar1 = &pIVar18->m_prev;
          pIVar16 = pIVar18;
          pIVar18 = *ppIVar1;
        } while (*ppIVar1 != (Instr *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::EmitClosureRangeChecks()
{
    if (m_func->frameDisplayCheckTable)
    {
        // Frame display checks. Again, chain to the instruction (LdEnv/LdSlot).
        FOREACH_HASHTABLE_ENTRY(FrameDisplayCheckRecord*, bucket, m_func->frameDisplayCheckTable)
        {
            StackSym *stackSym = m_func->m_symTable->FindStackSym(bucket.value);
            Assert(stackSym && stackSym->m_instrDef);

            IR::Instr *instrDef = stackSym->m_instrDef;
            IR::Instr *insertInstr = instrDef->m_next;
            IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
            IR::Instr *instr = IR::Instr::New(Js::OpCode::FrameDisplayCheck, dstOpnd, m_func);

            dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            instrDef->SetDst(dstOpnd);
            instr->SetSrc1(dstOpnd);

            // Attach the two-dimensional check info.
            IR::AddrOpnd *recordOpnd = IR::AddrOpnd::New(bucket.element, IR::AddrOpndKindDynamicMisc, m_func, true);
            instr->SetSrc2(recordOpnd);

            insertInstr->InsertBefore(instr);
        }
        NEXT_HASHTABLE_ENTRY;
    }

    // If not a loop, but there are loops and trys, restore scope slot pointer and FD
    if (!m_func->IsLoopBody() && m_func->HasTry() && m_func->GetJITFunctionBody()->GetByteCodeInLoopCount() != 0)
    {
        BVSparse<JitArenaAllocator> * bv = nullptr;
        if (m_func->GetLocalClosureSym() && m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
        {
            bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            bv->Set(m_func->GetLocalClosureSym()->m_id);
        }
        if (m_func->GetLocalFrameDisplaySym() && m_func->GetLocalFrameDisplaySym()->HasByteCodeRegSlot())
        {
            if (!bv)
            {
                bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            }
            bv->Set(m_func->GetLocalFrameDisplaySym()->m_id);
        }
        if (bv)
        {

            FOREACH_INSTR_IN_FUNC_BACKWARD(instr, m_func)
            {
                if (instr->m_opcode == Js::OpCode::Ret)
                {
                    IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(instr);
                    byteCodeUse->SetBV(bv);
                    instr->InsertBefore(byteCodeUse);
                    break;
                }
            }
            NEXT_INSTR_IN_FUNC_BACKWARD;
        }
    }
}